

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.cpp
# Opt level: O0

bool __thiscall wallet::BerkeleyROBatch::HasKey(BerkeleyROBatch *this,DataStream *key)

{
  long lVar1;
  iterator __last;
  size_type sVar2;
  __normal_iterator<std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
  in_RSI;
  long in_FS_OFFSET;
  byte bVar3;
  SerializeData key_data;
  DataStream *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  allocator_type *in_stack_ffffffffffffffa0;
  vector<std::byte,_zero_after_free_allocator<std::byte>_> *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __last = DataStream::begin((DataStream *)
                             CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  DataStream::end(in_stack_ffffffffffffff80);
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::
  vector<__gnu_cxx::__normal_iterator<std::byte*,std::vector<std::byte,zero_after_free_allocator<std::byte>>>,void>
            (in_stack_ffffffffffffffa8,in_RSI,
             (__normal_iterator<std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
              )__last._M_current,in_stack_ffffffffffffffa0);
  sVar2 = std::
          map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
          ::count((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
                   *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
                  &in_stack_ffffffffffffff80->vch);
  bVar3 = sVar2 != 0;
  std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::~vector
            ((vector<std::byte,_zero_after_free_allocator<std::byte>_> *)
             CONCAT17(bVar3,in_stack_ffffffffffffff88));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar3 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool BerkeleyROBatch::HasKey(DataStream&& key)
{
    SerializeData key_data{key.begin(), key.end()};
    return m_database.m_records.count(key_data) > 0;
}